

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::reportSolvedLpQpStats(Highs *this)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  ulong __nbytes;
  double *pdVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  long in_RDI;
  HighsLogOptions *log_options_;
  double run_time;
  double relative_primal_dual_gap;
  HighsStatus status;
  double dual_objective_value;
  HighsLogOptions *log_options;
  Highs *log_options__00;
  Highs *in_stack_ffffffffffffff80;
  double local_68;
  double local_60;
  HighsLogOptions *local_58;
  HighsStatus local_4c;
  double local_48;
  string local_30 [32];
  Highs *local_10;
  
  if ((*(byte *)(in_RDI + 0xc80) & 1) != 0) {
    local_10 = (Highs *)(in_RDI + 0xe28);
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      in_stack_ffffffffffffff80 = local_10;
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)in_stack_ffffffffffffff80,kInfo,"Model name          : %s\n",
                   uVar4);
    }
    log_options__00 = local_10;
    modelStatusToString_abi_cxx11_(local_10,(HighsModelStatus)((ulong)local_30 >> 0x20));
    __nbytes = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)log_options__00,kInfo,"Model status        : %s\n");
    std::__cxx11::string::~string(local_30);
    __buf = extraout_RDX;
    if ((*(byte *)(in_RDI + 0xeb0) & 1) != 0) {
      if (*(int *)(in_RDI + 0xec0) != 0) {
        __nbytes = (ulong)*(uint *)(in_RDI + 0xec0);
        highsLogUser((HighsLogOptions *)local_10,kInfo,"Simplex   iterations: %d\n");
      }
      if (*(int *)(in_RDI + 0xec4) != 0) {
        __nbytes = (ulong)*(uint *)(in_RDI + 0xec4);
        highsLogUser((HighsLogOptions *)local_10,kInfo,"IPM       iterations: %d\n");
      }
      if (*(int *)(in_RDI + 0xec8) != 0) {
        __nbytes = (ulong)*(uint *)(in_RDI + 0xec8);
        highsLogUser((HighsLogOptions *)local_10,kInfo,"Crossover iterations: %d\n");
      }
      if (*(int *)(in_RDI + 0xecc) != 0) {
        __nbytes = (ulong)*(uint *)(in_RDI + 0xecc);
        highsLogUser((HighsLogOptions *)local_10,kInfo,"PDLP      iterations: %d\n");
      }
      if (*(int *)(in_RDI + 0xed0) != 0) {
        __nbytes = (ulong)*(uint *)(in_RDI + 0xed0);
        highsLogUser((HighsLogOptions *)local_10,kInfo,"QP ASM    iterations: %d\n");
      }
      highsLogUser(*(HighsLogOptions **)(in_RDI + 0xee0),(HighsLogType)local_10,(char *)0x1,
                   "Objective value     : %17.10e\n");
      __buf = extraout_RDX_00;
    }
    if (((*(byte *)(in_RDI + 9) & 1) != 0) &&
       (bVar2 = HighsModel::isQp((HighsModel *)(in_RDI + 0x138)), __buf = extraout_RDX_01, !bVar2))
    {
      local_4c = getDualObjectiveValue(in_stack_ffffffffffffff80,(double *)log_options__00);
      __nbytes = (ulong)(uint)local_4c;
      dVar1 = *(double *)(in_RDI + 0xee0);
      local_60 = 1.0;
      local_68 = ABS(*(double *)(in_RDI + 0xee0));
      pdVar5 = std::max<double>(&local_60,&local_68);
      local_58 = (HighsLogOptions *)(ABS(dVar1 - local_48) / *pdVar5);
      highsLogUser(local_58,(HighsLogType)local_10,(char *)0x1,"Relative P-D gap    : %17.10e\n");
      __buf = extraout_RDX_02;
    }
    if ((*(byte *)(in_RDI + 0xc82) & 1) == 0) {
      HighsTimer::read((HighsTimer *)(in_RDI + 0x920),0,__buf,__nbytes);
      highsLogUser(log_options_,(HighsLogType)local_10,(char *)0x1,"HiGHS run time      : %13.2f\n")
      ;
    }
  }
  return;
}

Assistant:

void Highs::reportSolvedLpQpStats() {
  if (!options_.output_flag) return;
  HighsLogOptions& log_options = options_.log_options;
  if (this->model_.lp_.model_name_.length())
    highsLogUser(log_options, HighsLogType::kInfo, "Model name          : %s\n",
                 model_.lp_.model_name_.c_str());
  highsLogUser(log_options, HighsLogType::kInfo, "Model status        : %s\n",
               modelStatusToString(model_status_).c_str());
  if (info_.valid) {
    if (info_.simplex_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Simplex   iterations: %" HIGHSINT_FORMAT "\n",
                   info_.simplex_iteration_count);
    if (info_.ipm_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "IPM       iterations: %" HIGHSINT_FORMAT "\n",
                   info_.ipm_iteration_count);
    if (info_.crossover_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Crossover iterations: %" HIGHSINT_FORMAT "\n",
                   info_.crossover_iteration_count);
    if (info_.pdlp_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "PDLP      iterations: %" HIGHSINT_FORMAT "\n",
                   info_.pdlp_iteration_count);
    if (info_.qp_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "QP ASM    iterations: %" HIGHSINT_FORMAT "\n",
                   info_.qp_iteration_count);
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective value     : %17.10e\n",
                 info_.objective_function_value);
  }
  if (solution_.dual_valid && !this->model_.isQp()) {
    double dual_objective_value;
    HighsStatus status = this->getDualObjectiveValue(dual_objective_value);
    assert(status == HighsStatus::kOk);
    const double relative_primal_dual_gap =
        std::fabs(info_.objective_function_value - dual_objective_value) /
        std::max(1.0, std::fabs(info_.objective_function_value));
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Relative P-D gap    : %17.10e\n", relative_primal_dual_gap);
  }
  if (!options_.timeless_log) {
    double run_time = timer_.read();
    highsLogUser(log_options, HighsLogType::kInfo,
                 "HiGHS run time      : %13.2f\n", run_time);
  }
}